

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# missing_deps_test.cc
# Opt level: O0

void __thiscall
MissingDependencyScannerTestMissingDepPresent::~MissingDependencyScannerTestMissingDepPresent
          (MissingDependencyScannerTestMissingDepPresent *this)

{
  MissingDependencyScannerTestMissingDepPresent *this_local;
  
  ~MissingDependencyScannerTestMissingDepPresent(this);
  operator_delete(this,0x410);
  return;
}

Assistant:

TEST_F(MissingDependencyScannerTest, MissingDepPresent) {
  CreateInitialState();
  // compiled_object uses generated_header, without a proper dependency
  RecordDepsLogDep("compiled_object", "generated_header");
  ProcessAllNodes();
  ASSERT_TRUE(scanner().HadMissingDeps());
  ASSERT_EQ(1u, scanner().nodes_missing_deps_.size());
  ASSERT_EQ(1u, scanner().missing_dep_path_count_);
  AssertMissingDependencyBetween("compiled_object", "generated_header",
                                 &generator_rule_);
}